

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

string * __thiscall
wabt::LoadStoreTracking::GenTypeDecl
          (string *__return_storage_ptr__,LoadStoreTracking *this,string *name)

{
  Address align;
  bool bVar1;
  pointer ppVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator<char> local_bd;
  Enum local_bc;
  string local_b8;
  Type local_98;
  char *local_90;
  Type local_88;
  Type local_80;
  string local_78;
  reference local_58;
  pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess> *access;
  const_iterator __end3;
  const_iterator __begin3;
  map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
  *__range3;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  string *name_local;
  LoadStoreTracking *this_local;
  string *s;
  
  it._M_node = (_Base_ptr)name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
       ::find(&this->vars,name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
       ::end(&this->vars);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&__range3 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
             ::operator->(&local_28);
    if (((ppVar2->second).struct_layout & 1U) == 0) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
               ::operator->(&local_28);
      local_88 = (ppVar2->second).same_type;
      bVar1 = wabt::operator!=(local_88,Void);
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
                 ::operator->(&local_28);
        local_98 = (ppVar2->second).same_type;
        local_90 = GetDecompTypeName(local_98);
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
                 ::operator->(&local_28);
        align = (ppVar2->second).same_align;
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
                 ::operator->(&local_28);
        local_bc = (ppVar2->second).last_opc.enum_;
        GenAlign_abi_cxx11_(&local_b8,this,align,(Opcode)local_bc);
        cat<char_const*,char[5],std::__cxx11::string>
                  (__return_storage_ptr__,(wabt *)&local_90,(char **)"_ptr",(char (*) [5])&local_b8,
                   in_R8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_bd);
        std::allocator<char>::~allocator(&local_bd);
      }
    }
    else {
      __range3._6_1_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"{ ",(allocator<char> *)((long)&__range3 + 5));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 5));
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
               ::operator->(&local_28);
      __end3 = std::
               map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
               ::begin(&(ppVar2->second).accesses);
      access = (pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess> *)
               std::
               map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
               ::end(&(ppVar2->second).accesses);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&access), bVar1) {
        local_58 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>
                   ::operator*(&__end3);
        if ((local_58->second).idx != 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
        IdxToName_abi_cxx11_(&local_78,this,(local_58->second).idx);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,':');
        local_80 = (local_58->second).type;
        pcVar3 = GetDecompTypeName(local_80);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
        std::
        _Rb_tree_const_iterator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>
        ::operator++(&__end3);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," }");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeDecl(const std::string& name) const {
    auto it = vars.find(name);
    if (it == vars.end()) {
      return "";
    }
    if (it->second.struct_layout) {
      std::string s = "{ ";
      for (auto& access : it->second.accesses) {
        if (access.second.idx) {
          s += ", ";
        }
        s += IdxToName(access.second.idx);
        s += ':';
        s += GetDecompTypeName(access.second.type);
      }
      s += " }";
      return s;
    }
    // We don't have a struct layout, or the struct has just one field,
    // so maybe we can just declare it as a pointer to one type?
    if (it->second.same_type != Type::Void) {
      return cat(GetDecompTypeName(it->second.same_type), "_ptr",
                 GenAlign(it->second.same_align, it->second.last_opc));
    }
    return "";
  }